

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ProgramBinaryPersistenceCase::verify
          (ProgramBinaryPersistenceCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  void *__s1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  void *extraout_RAX;
  ProgramBinary currentBinary;
  ProgramBinary local_1b8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  void *pvVar4;
  
  pTVar1 = ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  local_1b8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ProgramBinaryCase::getProgramBinary
            (&this->super_ProgramBinaryCase,&local_1b8,*(GLuint *)(ctx + 8));
  if (*(GLenum *)sig == local_1b8.format) {
    __s1 = *(void **)(sig + 8);
    pvVar4 = *(void **)(sig + 0x10);
    if ((long)pvVar4 - (long)__s1 ==
        (long)local_1b8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_1b8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      if (pvVar4 == __s1) goto LAB_010948dc;
      uVar2 = bcmp(__s1,local_1b8.data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,(long)pvVar4 - (long)__s1);
      pvVar4 = (void *)(ulong)uVar2;
      if (uVar2 == 0) goto LAB_010948dc;
    }
  }
  this_00 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Fail, program binary may only change as a result of linking or loading.",0x47);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  tcu::TestContext::setTestResult
            ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,"Program binary changed");
  pvVar4 = extraout_RAX;
LAB_010948dc:
  iVar3 = (int)pvVar4;
  if (local_1b8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar3 = extraout_EAX;
  }
  return iVar3;
}

Assistant:

void ProgramBinaryPersistenceCase::verify (glu::Program& program, const ProgramBinary& binary)
{
	TestLog&		log				= m_testCtx.getLog();
	ProgramBinary	currentBinary;

	getProgramBinary(currentBinary, program.getProgram());

	if (!programBinariesEqual(binary, currentBinary))
	{
		log << TestLog::Message << "Fail, program binary may only change as a result of linking or loading." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program binary changed");
	}
}